

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# y4minput.c
# Opt level: O3

int y4m_input_fetch_frame(y4m_input *_y4m,FILE *_fin,aom_image_t *_img)

{
  uint uVar1;
  uchar *puVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  undefined8 in_RAX;
  long lVar7;
  bool bVar8;
  char c;
  char frame [6];
  undefined8 uStack_38;
  
  uVar1 = _y4m->bit_depth;
  uStack_38 = in_RAX;
  iVar5 = file_read((void *)((long)&uStack_38 + 2),6,_fin);
  if (iVar5 == 0) {
    iVar5 = 0;
  }
  else {
    if (uStack_38._6_1_ == 'E' && uStack_38._2_4_ == 0x4d415246) {
      if (uStack_38._7_1_ == '\n') {
LAB_00124c39:
        iVar5 = file_read(_y4m->dst_buf,_y4m->dst_buf_read_sz,_fin);
        if (iVar5 == 0) {
          y4m_input_fetch_frame_cold_4();
        }
        else {
          iVar5 = file_read(_y4m->aux_buf,_y4m->aux_buf_read_sz,_fin);
          if (iVar5 != 0) {
            bVar8 = 8 < uVar1;
            (*_y4m->convert)(_y4m,_y4m->dst_buf,_y4m->aux_buf);
            memset(_img,0,0xa8);
            _img->fmt = _y4m->aom_fmt;
            uVar3 = _y4m->pic_w;
            uVar4 = _y4m->pic_h;
            _img->d_h = uVar4;
            uVar1 = _y4m->bit_depth;
            _img->w = uVar3;
            _img->h = uVar4;
            _img->bit_depth = uVar1;
            _img->d_w = uVar3;
            iVar5 = _y4m->dst_c_dec_h;
            _img->x_chroma_shift = iVar5 >> 1;
            iVar6 = _y4m->dst_c_dec_v;
            _img->y_chroma_shift = iVar6 >> 1;
            _img->bps = _y4m->bps;
            iVar5 = (int)(uVar3 + iVar5 + -1) / iVar5 << bVar8;
            _img->stride[0] = uVar3 << bVar8;
            _img->stride[2] = iVar5;
            _img->stride[1] = iVar5;
            puVar2 = _y4m->dst_buf;
            _img->planes[0] = puVar2;
            lVar7 = (long)(int)(uVar4 * uVar3 << bVar8);
            _img->planes[1] = puVar2 + lVar7;
            _img->planes[2] = _y4m->dst_buf + ((int)(uVar4 + iVar6 + -1) / iVar6) * iVar5 + lVar7;
            return 1;
          }
          y4m_input_fetch_frame_cold_3();
        }
      }
      else {
        iVar5 = 0x4f;
        do {
          iVar6 = file_read((void *)((long)&uStack_38 + 1),1,_fin);
          if ((iVar6 == 0) || (uStack_38._1_1_ == '\n')) goto LAB_00124c39;
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
        y4m_input_fetch_frame_cold_2();
      }
    }
    else {
      y4m_input_fetch_frame_cold_1();
    }
    iVar5 = -1;
  }
  return iVar5;
}

Assistant:

int y4m_input_fetch_frame(y4m_input *_y4m, FILE *_fin, aom_image_t *_img) {
  char frame[6];
  int pic_sz;
  int c_w;
  int c_h;
  int c_sz;
  int bytes_per_sample = _y4m->bit_depth > 8 ? 2 : 1;
  /*Read and skip the frame header.*/
  if (!file_read(frame, 6, _fin)) return 0;
  if (memcmp(frame, "FRAME", 5)) {
    fprintf(stderr, "Loss of framing in Y4M input data\n");
    return -1;
  }
  if (frame[5] != '\n') {
    char c;
    int j;
    for (j = 0; j < 79 && file_read(&c, 1, _fin) && c != '\n'; j++) {
    }
    if (j == 79) {
      fprintf(stderr, "Error parsing Y4M frame header\n");
      return -1;
    }
  }
  /*Read the frame data that needs no conversion.*/
  if (!file_read(_y4m->dst_buf, _y4m->dst_buf_read_sz, _fin)) {
    fprintf(stderr, "Error reading Y4M frame data.\n");
    return -1;
  }
  /*Read the frame data that does need conversion.*/
  if (!file_read(_y4m->aux_buf, _y4m->aux_buf_read_sz, _fin)) {
    fprintf(stderr, "Error reading Y4M frame data.\n");
    return -1;
  }
  /*Now convert the just read frame.*/
  (*_y4m->convert)(_y4m, _y4m->dst_buf, _y4m->aux_buf);
  /*Fill in the frame buffer pointers.
    We don't use aom_img_wrap() because it forces padding for odd picture
     sizes, which would require a separate fread call for every row.*/
  memset(_img, 0, sizeof(*_img));
  /*Y4M has the planes in Y'CbCr order, which libaom calls Y, U, and V.*/
  _img->fmt = _y4m->aom_fmt;
  _img->w = _img->d_w = _y4m->pic_w;
  _img->h = _img->d_h = _y4m->pic_h;
  _img->bit_depth = _y4m->bit_depth;
  _img->x_chroma_shift = _y4m->dst_c_dec_h >> 1;
  _img->y_chroma_shift = _y4m->dst_c_dec_v >> 1;
  _img->bps = _y4m->bps;

  /*Set up the buffer pointers.*/
  pic_sz = _y4m->pic_w * _y4m->pic_h * bytes_per_sample;
  c_w = (_y4m->pic_w + _y4m->dst_c_dec_h - 1) / _y4m->dst_c_dec_h;
  c_w *= bytes_per_sample;
  c_h = (_y4m->pic_h + _y4m->dst_c_dec_v - 1) / _y4m->dst_c_dec_v;
  c_sz = c_w * c_h;
  _img->stride[AOM_PLANE_Y] = _y4m->pic_w * bytes_per_sample;
  _img->stride[AOM_PLANE_U] = _img->stride[AOM_PLANE_V] = c_w;
  _img->planes[AOM_PLANE_Y] = _y4m->dst_buf;
  _img->planes[AOM_PLANE_U] = _y4m->dst_buf + pic_sz;
  _img->planes[AOM_PLANE_V] = _y4m->dst_buf + pic_sz + c_sz;
  return 1;
}